

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::FindEntry
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char **a_pData,
          char **a_pSection,char **a_pKey,char **a_pVal,char **a_pComment)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  char *pcVar5;
  byte *pbVar6;
  long lVar7;
  
  *a_pComment = (char *)0x0;
  if (**a_pData != '\0') {
    while( true ) {
      bVar1 = **a_pData;
      pbVar4 = (byte *)*a_pData;
      while( true ) {
        if (bVar1 == 0) {
          return false;
        }
        pbVar3 = pbVar4 + 1;
        if ((0x20 < bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
        *a_pData = (char *)pbVar3;
        bVar1 = *pbVar3;
        pbVar4 = pbVar3;
      }
      if (bVar1 == 0) break;
      if ((bVar1 == 0x23) || (bVar1 == 0x3b)) {
        LoadMultiLineText(this,a_pData,a_pComment,(char *)0x0,true);
      }
      else {
        if (bVar1 != 0x5b) {
          *a_pKey = (char *)pbVar4;
          pbVar4 = (byte *)*a_pData;
LAB_0018f268:
          bVar1 = *pbVar4;
          if (bVar1 < 0xd) {
            if ((bVar1 != 0) && (bVar1 != 10)) goto LAB_0018f285;
          }
          else if (bVar1 != 0xd) {
            if (bVar1 != 0x3d) goto LAB_0018f285;
            pbVar3 = (byte *)*a_pKey;
            if (pbVar4 == pbVar3) {
              pbVar4 = (byte *)*a_pData;
              while( true ) {
                if ((*pbVar4 < 0xe) && ((0x2401U >> (*pbVar4 & 0x1f) & 1) != 0)) break;
                *a_pData = (char *)(pbVar4 + 1);
                pbVar4 = pbVar4 + 1;
              }
              goto LAB_0018f24e;
            }
            pbVar6 = pbVar4 + -1;
            if (pbVar6 < pbVar3) goto LAB_0018f367;
            goto LAB_0018f34a;
          }
          goto LAB_0018f24e;
        }
        while( true ) {
          *a_pData = (char *)pbVar3;
          if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))
          break;
          pbVar3 = pbVar3 + 1;
        }
        *a_pSection = (char *)pbVar3;
        pbVar4 = (byte *)*a_pData;
        while( true ) {
          bVar1 = *pbVar4;
          if ((bVar1 < 0xe) && ((0x2401U >> (bVar1 & 0x1f) & 1) != 0)) break;
          if (bVar1 == 0x5d) {
            pbVar3 = pbVar4 + -1;
            if (pbVar3 < *a_pSection) goto LAB_0018f313;
            goto LAB_0018f2f6;
          }
          pbVar4 = pbVar4 + 1;
          *a_pData = (char *)pbVar4;
        }
      }
LAB_0018f24e:
      if (**a_pData == '\0') {
        return false;
      }
    }
  }
  return false;
LAB_0018f285:
  pbVar4 = pbVar4 + 1;
  *a_pData = (char *)pbVar4;
  goto LAB_0018f268;
  while (pbVar6 = pbVar6 + -1, pbVar3 <= pbVar6) {
LAB_0018f34a:
    if ((0x20 < (ulong)*pbVar6) || ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) break;
  }
  pbVar4 = pbVar6 + 1;
LAB_0018f367:
  *pbVar4 = 0;
  pcVar5 = *a_pData;
  do {
    do {
      pcVar5 = pcVar5 + 1;
      *a_pData = pcVar5;
    } while (*pcVar5 == ' ');
  } while (*pcVar5 == '\t');
  *a_pVal = pcVar5;
  bVar1 = **a_pData;
  pbVar4 = (byte *)*a_pData;
  while (bVar1 != 0) {
    if ((bVar1 == 10) || (bVar1 == 0xd)) {
      if (bVar1 != 0) {
        lVar7 = 1;
        if (bVar1 == 0xd) {
          lVar7 = (ulong)(pbVar4[1] == 10) + 1;
        }
        *a_pData = (char *)(pbVar4 + lVar7);
      }
      break;
    }
    *a_pData = (char *)(pbVar4 + 1);
    bVar1 = pbVar4[1];
    pbVar4 = pbVar4 + 1;
  }
  pbVar3 = pbVar4 + -1;
  if (*a_pVal <= pbVar3) {
    do {
      if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
      pbVar3 = pbVar3 + -1;
    } while (*a_pVal <= pbVar3);
    pbVar4 = pbVar3 + 1;
  }
  *pbVar4 = 0;
  if (this->m_bAllowMultiLine != true) {
    return true;
  }
  pcVar5 = *a_pVal;
  if (*pcVar5 != '<') {
    return true;
  }
  if (pcVar5[1] != '<') {
    return true;
  }
  if (pcVar5[2] == '<') {
    bVar2 = LoadMultiLineText(this,a_pData,a_pVal,pcVar5 + 3,false);
    return bVar2;
  }
  return true;
  while (pbVar3 = pbVar3 + -1, *a_pSection <= pbVar3) {
LAB_0018f2f6:
    if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
  }
  pbVar4 = pbVar3 + 1;
LAB_0018f313:
  *pbVar4 = 0;
  pbVar4 = (byte *)(*a_pData + 1);
  do {
    do {
      *a_pData = (char *)pbVar4;
      bVar1 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (0xd < bVar1);
  } while ((0x2401U >> (bVar1 & 0x1f) & 1) == 0);
  *a_pKey = (char *)0x0;
  *a_pVal = (char *)0x0;
  return true;
}

Assistant:

bool CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::FindEntry(SI_CHAR *&a_pData, const SI_CHAR *&a_pSection,
																   const SI_CHAR *&a_pKey, const SI_CHAR *&a_pVal,
																   const SI_CHAR *&a_pComment) const {
	a_pComment = NULL;

	SI_CHAR *pTrail = NULL;
	while (*a_pData) {
		// skip spaces and empty lines
		while (*a_pData && IsSpace(*a_pData)) {
			++a_pData;
		}
		if (!*a_pData) {
			break;
		}

		// skip processing of comment lines but keep a pointer to
		// the start of the comment.
		if (IsComment(*a_pData)) {
			LoadMultiLineText(a_pData, a_pComment, NULL, true);
			continue;
		}

		// process section names
		if (*a_pData == '[') {
			// skip leading spaces
			++a_pData;
			while (*a_pData && IsSpace(*a_pData)) {
				++a_pData;
			}

			// find the end of the section name (it may contain spaces)
			// and convert it to lowercase as necessary
			a_pSection = a_pData;
			while (*a_pData && *a_pData != ']' && !IsNewLineChar(*a_pData)) {
				++a_pData;
			}

			// if it's an invalid line, just skip it
			if (*a_pData != ']') {
				continue;
			}

			// remove trailing spaces from the section
			pTrail = a_pData - 1;
			while (pTrail >= a_pSection && IsSpace(*pTrail)) {
				--pTrail;
			}
			++pTrail;
			*pTrail = 0;

			// skip to the end of the line
			++a_pData;  // safe as checked that it == ']' above
			while (*a_pData && !IsNewLineChar(*a_pData)) {
				++a_pData;
			}

			a_pKey = NULL;
			a_pVal = NULL;
			return true;
		}

		// find the end of the key name (it may contain spaces)
		// and convert it to lowercase as necessary
		a_pKey = a_pData;
		while (*a_pData && *a_pData != '=' && !IsNewLineChar(*a_pData)) {
			++a_pData;
		}

		// if it's an invalid line, just skip it
		if (*a_pData != '=') {
			continue;
		}

		// empty keys are invalid
		if (a_pKey == a_pData) {
			while (*a_pData && !IsNewLineChar(*a_pData)) {
				++a_pData;
			}
			continue;
		}

		// remove trailing spaces from the key
		pTrail = a_pData - 1;
		while (pTrail >= a_pKey && IsSpace(*pTrail)) {
			--pTrail;
		}
		++pTrail;
		*pTrail = 0;

		// skip leading whitespace on the value
		++a_pData;  // safe as checked that it == '=' above
		while (*a_pData && !IsNewLineChar(*a_pData) && IsSpace(*a_pData)) {
			++a_pData;
		}

		// find the end of the value which is the end of this line
		a_pVal = a_pData;
		while (*a_pData && !IsNewLineChar(*a_pData)) {
			++a_pData;
		}

		// remove trailing spaces from the value
		pTrail = a_pData - 1;
		if (*a_pData) {  // prepare for the next round
			SkipNewLine(a_pData);
		}
		while (pTrail >= a_pVal && IsSpace(*pTrail)) {
			--pTrail;
		}
		++pTrail;
		*pTrail = 0;

		// check for multi-line entries
		if (m_bAllowMultiLine && IsMultiLineTag(a_pVal)) {
			// skip the "<<<" to get the tag that will end the multiline
			const SI_CHAR *pTagName = a_pVal + 3;
			return LoadMultiLineText(a_pData, a_pVal, pTagName);
		}

		// return the standard entry
		return true;
	}

	return false;
}